

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationBuilder::setCaseBits
          (CollationBuilder *this,UnicodeString *nfdString,char **parserErrorReason,
          UErrorCode *errorCode)

{
  CollationData *d;
  bool bVar1;
  uint uVar2;
  UBool UVar3;
  int32_t iVar4;
  uint uVar5;
  char16_t *s_00;
  ulong uVar6;
  ulong uStack_220;
  int32_t strength;
  int64_t ce_1;
  int32_t i_2;
  uint32_t c;
  int64_t ce;
  int local_200;
  int32_t i_1;
  int32_t numBasePrimaries;
  uint32_t lastCase;
  undefined1 local_1e0 [4];
  int32_t baseCEsLength;
  UTF16CollationIterator baseCEs;
  UChar *s;
  int64_t cases;
  int32_t i;
  int32_t numTailoredPrimaries;
  UErrorCode *errorCode_local;
  char **parserErrorReason_local;
  UnicodeString *nfdString_local;
  CollationBuilder *this_local;
  
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 == '\0') {
    cases._4_4_ = 0;
    for (cases._0_4_ = 0; (int)cases < this->cesLength; cases._0_4_ = (int)cases + 1) {
      iVar4 = ceStrength(this->ces[(int)cases]);
      if (iVar4 == 0) {
        cases._4_4_ = cases._4_4_ + 1;
      }
    }
    s = (UChar *)0x0;
    if (0 < cases._4_4_) {
      s_00 = UnicodeString::getBuffer(nfdString);
      d = this->baseData;
      baseCEs.limit = s_00;
      iVar4 = UnicodeString::length(nfdString);
      UTF16CollationIterator::UTF16CollationIterator
                ((UTF16CollationIterator *)local_1e0,d,'\0',s_00,s_00,s_00 + iVar4);
      iVar4 = CollationIterator::fetchCEs((CollationIterator *)local_1e0,errorCode);
      UVar3 = ::U_FAILURE(*errorCode);
      if (UVar3 == '\0') {
        i_1 = 0;
        local_200 = 0;
        for (ce._4_4_ = 0; ce._4_4_ < iVar4 + -1; ce._4_4_ = ce._4_4_ + 1) {
          uVar6 = CollationIterator::getCE((CollationIterator *)local_1e0,ce._4_4_);
          uVar2 = i_1;
          if ((long)uVar6 >> 0x20 != 0) {
            local_200 = local_200 + 1;
            uVar5 = (uint)(uVar6 >> 0xe) & 3;
            if (local_200 < cases._4_4_) {
              s = (UChar *)((ulong)uVar5 << (((char)local_200 + -1) * '\x02' & 0x3fU) | (ulong)s);
            }
            else {
              uVar2 = uVar5;
              if ((local_200 != cases._4_4_) && (uVar2 = i_1, uVar5 != i_1)) {
                i_1 = 1;
                break;
              }
            }
          }
          i_1 = uVar2;
        }
        if (cases._4_4_ <= local_200) {
          s = (UChar *)((ulong)(uint)i_1 << (((char)cases._4_4_ + -1) * '\x02' & 0x3fU) | (ulong)s);
        }
        bVar1 = false;
      }
      else {
        *parserErrorReason = "fetching root CEs for tailored string";
        bVar1 = true;
      }
      UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)local_1e0);
      if (bVar1) {
        return;
      }
    }
    for (ce_1._0_4_ = 0; (int)ce_1 < this->cesLength; ce_1._0_4_ = (int)ce_1 + 1) {
      uStack_220 = this->ces[(int)ce_1] & 0xffffffffffff3fff;
      iVar4 = ceStrength(uStack_220);
      if (iVar4 == 0) {
        uStack_220 = ((ulong)s & 3) << 0xe | uStack_220;
        s = (UChar *)((long)s >> 2);
      }
      else if (iVar4 == 2) {
        uStack_220 = uStack_220 | 0x8000;
      }
      this->ces[(int)ce_1] = uStack_220;
    }
  }
  return;
}

Assistant:

void
CollationBuilder::setCaseBits(const UnicodeString &nfdString,
                              const char *&parserErrorReason, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    int32_t numTailoredPrimaries = 0;
    for(int32_t i = 0; i < cesLength; ++i) {
        if(ceStrength(ces[i]) == UCOL_PRIMARY) { ++numTailoredPrimaries; }
    }
    // We should not be able to get too many case bits because
    // cesLength<=31==MAX_EXPANSION_LENGTH.
    // 31 pairs of case bits fit into an int64_t without setting its sign bit.
    U_ASSERT(numTailoredPrimaries <= 31);

    int64_t cases = 0;
    if(numTailoredPrimaries > 0) {
        const UChar *s = nfdString.getBuffer();
        UTF16CollationIterator baseCEs(baseData, FALSE, s, s, s + nfdString.length());
        int32_t baseCEsLength = baseCEs.fetchCEs(errorCode) - 1;
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "fetching root CEs for tailored string";
            return;
        }
        U_ASSERT(baseCEsLength >= 0 && baseCEs.getCE(baseCEsLength) == Collation::NO_CE);

        uint32_t lastCase = 0;
        int32_t numBasePrimaries = 0;
        for(int32_t i = 0; i < baseCEsLength; ++i) {
            int64_t ce = baseCEs.getCE(i);
            if((ce >> 32) != 0) {
                ++numBasePrimaries;
                uint32_t c = ((uint32_t)ce >> 14) & 3;
                U_ASSERT(c == 0 || c == 2);  // lowercase or uppercase, no mixed case in any base CE
                if(numBasePrimaries < numTailoredPrimaries) {
                    cases |= (int64_t)c << ((numBasePrimaries - 1) * 2);
                } else if(numBasePrimaries == numTailoredPrimaries) {
                    lastCase = c;
                } else if(c != lastCase) {
                    // There are more base primary CEs than tailored primaries.
                    // Set mixed case if the case bits of the remainder differ.
                    lastCase = 1;
                    // Nothing more can change.
                    break;
                }
            }
        }
        if(numBasePrimaries >= numTailoredPrimaries) {
            cases |= (int64_t)lastCase << ((numTailoredPrimaries - 1) * 2);
        }
    }

    for(int32_t i = 0; i < cesLength; ++i) {
        int64_t ce = ces[i] & INT64_C(0xffffffffffff3fff);  // clear old case bits
        int32_t strength = ceStrength(ce);
        if(strength == UCOL_PRIMARY) {
            ce |= (cases & 3) << 14;
            cases >>= 2;
        } else if(strength == UCOL_TERTIARY) {
            // Tertiary CEs must have uppercase bits.
            // See the LDML spec, and comments in class CollationCompare.
            ce |= 0x8000;
        }
        // Tertiary ignorable CEs must have 0 case bits.
        // We set 0 case bits for secondary CEs too
        // since currently only U+0345 is cased and maps to a secondary CE,
        // and it is lowercase. Other secondaries are uncased.
        // See [[:Cased:]&[:uca1=:]] where uca1 queries the root primary weight.
        ces[i] = ce;
    }
}